

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUpsampleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pcVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  size_type *psVar12;
  ulong *puVar13;
  ulong uVar14;
  Result *_result;
  undefined8 uVar15;
  undefined1 *puVar16;
  uint uVar17;
  string err;
  string __str;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  if (this->ndArrayInterpretation == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Upsample","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar8 = Result::good(__return_storage_ptr__);
    if (!bVar8) {
      return __return_storage_ptr__;
    }
    pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Upsample","");
    validateRankCount(__return_storage_ptr__,layer,&local_130,3,-1,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    bVar8 = Result::good(__return_storage_ptr__);
    if (!bVar8) {
      return __return_storage_ptr__;
    }
    pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0xd2) {
    puVar16 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar16 = Specification::_UpsampleLayerParams_default_instance_;
  }
  iVar2 = (((ConvolutionLayerParams *)puVar16)->kernelsize_).current_size_;
  iVar3 = (((ConvolutionLayerParams *)puVar16)->stride_).current_size_;
  if (iVar2 == 0) {
    if (iVar3 == 0) goto LAB_0033baff;
    if (iVar3 != 2) goto LAB_0033bb1e;
    if ((((UpsampleLayerParams *)puVar16)->mode_ != 0) &&
       (((PoolingLayerParams *)puVar16)->type_ != 0)) goto LAB_0033bb06;
    std::operator+(&local_110,"Invalid upsample layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_130.field_2._M_allocated_capacity = *psVar12;
      local_130.field_2._8_8_ = puVar10[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar12;
      local_130._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_130._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
  }
  else {
    if (iVar2 != 2 || iVar3 != 0) {
LAB_0033bb1e:
      std::operator+(&local_50,"Invalid scaling factor in upsampling layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar13 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar13) {
        local_c0 = *puVar13;
        lStack_b8 = plVar9[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *puVar13;
        local_d0 = (ulong *)*plVar9;
      }
      local_c8 = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar4 = (((ConvolutionLayerParams *)puVar16)->kernelsize_).current_size_;
      uVar6 = -uVar4;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
      uVar17 = 1;
      if (9 < uVar6) {
        uVar14 = (ulong)uVar6;
        uVar7 = 4;
        do {
          uVar17 = uVar7;
          uVar11 = (uint)uVar14;
          if (uVar11 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0033bc5e;
          }
          if (uVar11 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0033bc5e;
          }
          if (uVar11 < 10000) goto LAB_0033bc5e;
          uVar14 = uVar14 / 10000;
          uVar7 = uVar17 + 4;
        } while (99999 < uVar11);
        uVar17 = uVar17 + 1;
      }
LAB_0033bc5e:
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar17 - (char)((int)uVar4 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_f0),uVar17,uVar6);
      uVar14 = 0xf;
      if (local_d0 != &local_c0) {
        uVar14 = local_c0;
      }
      if (uVar14 < (ulong)(local_e8 + local_c8)) {
        uVar14 = 0xf;
        if (local_f0 != local_e0) {
          uVar14 = local_e0[0];
        }
        if (uVar14 < (ulong)(local_e8 + local_c8)) goto LAB_0033bcd5;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
      }
      else {
LAB_0033bcd5:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
      }
      local_b0 = &local_a0;
      plVar9 = puVar10 + 2;
      if ((long *)*puVar10 == plVar9) {
        local_a0 = *plVar9;
        uStack_98 = puVar10[3];
      }
      else {
        local_a0 = *plVar9;
        local_b0 = (long *)*puVar10;
      }
      local_a8 = puVar10[1];
      *puVar10 = plVar9;
      puVar10[1] = 0;
      *(undefined1 *)plVar9 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
      paVar1 = &local_110.field_2;
      puVar13 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_110.field_2._M_allocated_capacity = *puVar13;
        local_110.field_2._8_8_ = plVar9[3];
        local_110._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar13;
        local_110._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_110._M_string_length = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar4 = (((ConvolutionLayerParams *)puVar16)->stride_).current_size_;
      uVar6 = -uVar4;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
      uVar17 = 1;
      if (9 < uVar6) {
        uVar14 = (ulong)uVar6;
        uVar7 = 4;
        do {
          uVar17 = uVar7;
          uVar11 = (uint)uVar14;
          if (uVar11 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0033bdff;
          }
          if (uVar11 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0033bdff;
          }
          if (uVar11 < 10000) goto LAB_0033bdff;
          uVar14 = uVar14 / 10000;
          uVar7 = uVar17 + 4;
        } while (99999 < uVar11);
        uVar17 = uVar17 + 1;
      }
LAB_0033bdff:
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar17 - (char)((int)uVar4 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_90),uVar17,uVar6);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        uVar15 = local_110.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_88 + local_110._M_string_length) {
        uVar14 = 0xf;
        if (local_90 != local_80) {
          uVar14 = local_80[0];
        }
        if (uVar14 < local_88 + local_110._M_string_length) goto LAB_0033be83;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_90,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
      }
      else {
LAB_0033be83:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_90);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_130.field_2._M_allocated_capacity = *psVar12;
        local_130.field_2._8_8_ = puVar10[3];
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar12;
        local_130._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_130._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)psVar12 = 0;
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p == &local_130.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0033bfb5;
    }
LAB_0033baff:
    if (((PoolingLayerParams *)puVar16)->type_ == 0) goto LAB_0033bb11;
LAB_0033bb06:
    if (((UpsampleLayerParams *)puVar16)->mode_ != 0) {
LAB_0033bb11:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_110,"Layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_130.field_2._M_allocated_capacity = *psVar12;
      local_130.field_2._8_8_ = puVar10[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar12;
      local_130._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_130._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p == &local_130.field_2) {
    return __return_storage_ptr__;
  }
LAB_0033bfb5:
  operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUpsampleLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Upsample", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Upsample", 3, -1, blobNameToRank));
    }

    const auto& params = layer.upsample();
    /* If scalingFactor or fractionalScalingFactor are provided, they must be mutually exclusive and of size 2.
                             scalingFactor
                             0 | 2 | Other
                      0      V   V   I
       fractionalSF   2      V   I   I
                      Other  I   I   I
     */
    bool validScalingFactors;
    if (params.scalingfactor_size() == 0) {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 || params.fractionalscalingfactor_size() == 2;
    } else {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 && params.scalingfactor_size() == 2;
    }
    if (!validScalingFactors) {
        std::string err = "Invalid scaling factor in upsampling layer '" + layer.name()
            + "'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
            + std::to_string(params.scalingfactor_size()) + " and fractionalScalingFactor of size " + std::to_string(params.fractionalscalingfactor_size());
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.fractionalscalingfactor_size() == 2
        && (params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN
            || params.linearupsamplemode() == Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT)) {
        std::string err = "Invalid upsample layer '" + layer.name() + "'. Fractional upsample only compatible with align_corners=true or align_corners=false";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if(params.linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT
       && params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN) {
        std::string err = "Layer '" + layer.name() + "' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}